

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::e_formatter<spdlog::details::null_scoped_padder>::format
          (e_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  char *__src;
  uint uVar4;
  ptrdiff_t _Num_1;
  ulong uVar5;
  ulong uVar6;
  ptrdiff_t _Num;
  size_t sVar7;
  format_int local_50;
  
  lVar1 = (msg->time).__d.__r;
  uVar5 = (lVar1 / 1000000000) * 0xfffffc18 + lVar1 / 1000000;
  uVar4 = (uint)uVar5;
  uVar2 = uVar4 | 1;
  uVar3 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar3 = (uVar3 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar3 = (uVar3 + 1) -
          (uint)(uVar4 < *(uint *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_32 +
                                  (ulong)uVar3 * 4));
  if (uVar3 < 3) {
    sVar7 = 3 - (ulong)uVar3;
    uVar6 = (dest->super_buffer<char>).size_ + sVar7;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar6);
    }
    if ((ulong)uVar3 != 3) {
      memcpy((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,
             "0000000000000000000",sVar7);
    }
    (dest->super_buffer<char>).size_ = uVar6;
  }
  __src = fmt::v6::format_int::format_decimal(&local_50,uVar5 & 0xffffffff);
  sVar7 = (long)(local_50.buffer_ + 0x15) - (long)__src;
  uVar5 = (dest->super_buffer<char>).size_ + sVar7;
  local_50.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar5);
  }
  if (local_50.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,sVar7);
  }
  (dest->super_buffer<char>).size_ = uVar5;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto millis = fmt_helper::time_fraction<std::chrono::milliseconds>(msg.time);
        const size_t field_size = 3;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
    }